

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

void __thiscall Liby::http::HttpClient::handleReadEvent(HttpClient *this,Connection *conn)

{
  uint uVar1;
  bool bVar2;
  Buffer *this_00;
  char *begin;
  char *pcVar3;
  off_t oVar4;
  reference pvVar5;
  size_t in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  Connection *__args;
  function<void_(Liby::http::Reply_&)> *handler;
  int savedBytes;
  Buffer *readBuf;
  Connection *conn_local;
  HttpClient *this_local;
  
  __args = conn;
  while( true ) {
    this_00 = (Buffer *)Connection::read(conn,(int)__args,in_RDX,in_RCX);
    bVar2 = Buffer::empty(this_00);
    if (bVar2) {
      return;
    }
    uVar1 = (this->parser_).bytes_;
    in_RCX = (size_t)uVar1;
    begin = Buffer::data(this_00);
    pcVar3 = Buffer::data(this_00);
    oVar4 = Buffer::size(this_00);
    ReplyParser::parse(&this->parser_,begin,pcVar3 + oVar4);
    __args = (Connection *)(long)(int)((this->parser_).bytes_ - uVar1);
    Buffer::retrieve(this_00,(off_t)__args);
    bVar2 = ReplyParser::isError(&this->parser_);
    if (bVar2) break;
    bVar2 = ReplyParser::isGood(&this->parser_);
    in_RDX = extraout_RDX;
    if (bVar2) {
      pvVar5 = std::__cxx11::
               list<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
               ::front(&this->sendReqeustLists_);
      bVar2 = std::function::operator_cast_to_bool((function *)&pvVar5->second);
      if (bVar2) {
        __args = (Connection *)&this->parser_;
        std::function<void_(Liby::http::Reply_&)>::operator()(&pvVar5->second,(Reply *)__args);
      }
      ReplyParser::clear(&this->parser_);
      std::__cxx11::
      list<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
      ::pop_front(&this->sendReqeustLists_);
      in_RDX = extraout_RDX_00;
    }
  }
  handleErroEvent(this,conn);
  return;
}

Assistant:

void HttpClient::handleReadEvent(Connection &conn) {
    while (1) {
        Buffer &readBuf = conn.read();
        if (readBuf.empty())
            return;

        int savedBytes = parser_.bytes_;
        parser_.parse(readBuf.data(), readBuf.data() + readBuf.size());
        readBuf.retrieve(parser_.bytes_ - savedBytes);

        if (parser_.isError()) {
            handleErroEvent(conn);
            return;
        }

        if (parser_.isGood()) {
            auto &handler = sendReqeustLists_.front().second;
            if (handler) {
                handler(parser_);
            }
            parser_.clear();
            sendReqeustLists_.pop_front();
        }
    }
}